

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O1

void __thiscall
DivideTest<long>::test_vectordivide_numerators<(libdivide::Branching)0>
          (DivideTest<long> *this,long denom,divider<long,_(libdivide::Branching)0> *the_divider)

{
  uint uVar1;
  long lVar2;
  size_t j;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  char mem [128];
  ulong local_80 [10];
  
  lVar2 = 0;
  do {
    uVar1 = this->seed;
    uVar4 = this->rand_n;
    lVar3 = 0;
    do {
      uVar1 = uVar1 * 0x19660d + 0x3c6ef35f;
      uVar5 = ((uVar1 & 1) + 1) * uVar4 + 3 + uVar4 % 0x1c9c381;
      bVar6 = uVar4 <= uVar5;
      uVar4 = (ulong)(uVar1 % 0x13);
      if (bVar6) {
        uVar4 = uVar5;
      }
      uVar5 = -uVar4;
      if ((uVar1 & 1) == 0) {
        uVar5 = uVar4;
      }
      local_80[lVar3] = uVar5;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    this->seed = uVar1;
    this->rand_n = uVar4;
    test_vec<long_long__vector(2),(libdivide::Branching)0>
              (this,(long *)local_80,8,denom,the_divider);
    test_vec<long_long__vector(4),(libdivide::Branching)0>
              (this,(long *)local_80,8,denom,the_divider);
    test_vec<long_long__vector(8),(libdivide::Branching)0>
              (this,(long *)local_80,8,denom,the_divider);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 10000);
  return;
}

Assistant:

void test_vectordivide_numerators(T denom, const divider<T, ALGO> &the_divider) {
#if defined(VECTOR_TESTS)
        // Align memory to 64 byte boundary for AVX512
        char mem[min_vector_count * sizeof(T) + 64];
        size_t offset = 64 - (size_t)&mem % 64;
        T *numers = (T *)&mem[offset];

        for (size_t i = 0; i < 10000; ++i) {
            for (size_t j = 0; j < min_vector_count; j++) {
                numers[j] = get_random();
            }
#ifdef LIBDIVIDE_SSE2
            test_vec<__m128i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_AVX2
            test_vec<__m256i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_AVX512
            test_vec<__m512i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_NEON
            test_vec<typename NeonVecFor<T>::type>(numers, min_vector_count, denom, the_divider);
#endif
        }
#else
        UNUSED(denom);
        UNUSED(the_divider);
#endif
    }